

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void world_recover(void *world_void)

{
  int iVar1;
  bool bVar2;
  reference ppCVar3;
  mapped_type *pmVar4;
  int *piVar5;
  double dVar6;
  undefined1 local_120 [8];
  PacketBuilder builder;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_61;
  key_type local_60;
  byte local_39;
  Character *pCStack_38;
  bool updated;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  World *world;
  void *world_void_local;
  
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                     ((vector<Character_*,_std::allocator<Character_*>_> *)
                      ((long)world_void + 0x498));
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end
                        ((vector<Character_*,_std::allocator<Character_*>_> *)
                         ((long)world_void + 0x498));
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                     *)&character), bVar2) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    pCStack_38 = *ppCVar3;
    local_39 = 0;
    if (pCStack_38->hp != pCStack_38->maxhp) {
      if (pCStack_38->sitting == SIT_STAND) {
        iVar1 = pCStack_38->maxhp;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"HPRecoverRate",&local_99);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)((long)world_void + 0x198),&local_98);
        dVar6 = util::variant::operator_cast_to_double(pmVar4);
        pCStack_38->hp = (int)((double)iVar1 * dVar6 + (double)pCStack_38->hp);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      else {
        iVar1 = pCStack_38->maxhp;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"SitHPRecoverRate",&local_61);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)((long)world_void + 0x198),&local_60);
        dVar6 = util::variant::operator_cast_to_double(pmVar4);
        pCStack_38->hp = (int)((double)iVar1 * dVar6 + (double)pCStack_38->hp);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      piVar5 = std::min<int>(&pCStack_38->hp,&pCStack_38->maxhp);
      pCStack_38->hp = *piVar5;
      local_39 = 1;
      if (pCStack_38->party != (Party *)0x0) {
        Party::UpdateHP(pCStack_38->party,pCStack_38);
      }
    }
    if (pCStack_38->tp != pCStack_38->maxtp) {
      if (pCStack_38->sitting == SIT_STAND) {
        iVar1 = pCStack_38->maxtp;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"TPRecoverRate",
                   (allocator<char> *)((long)&builder.add_size + 7));
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)((long)world_void + 0x198),&local_e8);
        dVar6 = util::variant::operator_cast_to_double(pmVar4);
        pCStack_38->tp = (int)((double)iVar1 * dVar6 + (double)pCStack_38->tp);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
      }
      else {
        iVar1 = pCStack_38->maxtp;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"SitTPRecoverRate",&local_c1);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)((long)world_void + 0x198),&local_c0);
        dVar6 = util::variant::operator_cast_to_double(pmVar4);
        pCStack_38->tp = (int)((double)iVar1 * dVar6 + (double)pCStack_38->tp);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      piVar5 = std::min<int>(&pCStack_38->tp,&pCStack_38->maxtp);
      pCStack_38->tp = *piVar5;
      local_39 = 1;
    }
    if ((local_39 & 1) != 0) {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_120,PACKET_RECOVER,PACKET_PLAYER,6);
      PacketBuilder::AddShort((PacketBuilder *)local_120,pCStack_38->hp);
      PacketBuilder::AddShort((PacketBuilder *)local_120,pCStack_38->tp);
      PacketBuilder::AddShort((PacketBuilder *)local_120,0);
      Character::Send(pCStack_38,(PacketBuilder *)local_120);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_120);
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void world_recover(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	UTIL_FOREACH(world->characters, character)
	{
		bool updated = false;

		if (character->hp != character->maxhp)
		{
			if (character->sitting != SIT_STAND) character->hp += character->maxhp * double(world->config["SitHPRecoverRate"]);
			else                                 character->hp += character->maxhp * double(world->config["HPRecoverRate"]);

			character->hp = std::min(character->hp, character->maxhp);
			updated = true;

			if (character->party)
			{
				character->party->UpdateHP(character);
			}
		}

		if (character->tp != character->maxtp)
		{
			if (character->sitting != SIT_STAND) character->tp += character->maxtp * double(world->config["SitTPRecoverRate"]);
			else                                 character->tp += character->maxtp * double(world->config["TPRecoverRate"]);

			character->tp = std::min(character->tp, character->maxtp);
			updated = true;
		}

		if (updated)
		{
			PacketBuilder builder(PACKET_RECOVER, PACKET_PLAYER, 6);
			builder.AddShort(character->hp);
			builder.AddShort(character->tp);
			builder.AddShort(0); // ?
			character->Send(builder);
		}
	}
}